

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSat.c
# Opt level: O2

Vec_Int_t * Abc_NtkGetCiSatVarNums(Abc_Ntk_t *pNtk)

{
  Vec_Int_t *p;
  Abc_Obj_t *pAVar1;
  int i;
  
  p = Vec_IntAlloc(pNtk->vCis->nSize);
  for (i = 0; i < pNtk->vCis->nSize; i = i + 1) {
    pAVar1 = Abc_NtkCi(pNtk,i);
    Vec_IntPush(p,(pAVar1->field_6).iTemp);
  }
  return p;
}

Assistant:

Vec_Int_t * Abc_NtkGetCiSatVarNums( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vCiIds;
    Abc_Obj_t * pObj;
    int i;
    vCiIds = Vec_IntAlloc( Abc_NtkCiNum(pNtk) );
    Abc_NtkForEachCi( pNtk, pObj, i )
        Vec_IntPush( vCiIds, (int)(ABC_PTRINT_T)pObj->pCopy );
    return vCiIds;
}